

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderInvarianceRule6Test::verifyResultData
          (TessellationShaderInvarianceRule6Test *this,void **all_iterations_data)

{
  float *tessellated_vertex_data;
  ostringstream *this_00;
  uint uVar1;
  float fVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  TestError *this_01;
  float *pfVar8;
  _tessellation_primitive_mode extraout_EDX;
  _tessellation_primitive_mode extraout_EDX_00;
  _tessellation_primitive_mode primitive_mode;
  ulong uVar9;
  _tessellation_primitive_mode primitive_mode_00;
  float *tessellated_vertex_data_00;
  float *tessellated_vertex_data_01;
  ulong uVar10;
  string primitive_mode_str;
  pointer local_248;
  ulong local_228;
  ulong local_220;
  long local_208;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  bVar5 = true;
  do {
    local_248 = (this->m_test_triangles_iterations).
                super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
                ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(this->m_test_triangles_iterations).
                  super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)local_248;
    if (bVar5) {
      primitive_mode_00 = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
      local_208 = 0x2e0;
      local_228 = 0;
    }
    else {
      local_228 = (ulong)(uint)((int)(uVar7 >> 2) * 0x38e38e39);
      local_248 = (this->m_test_quads_iterations).
                  super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(this->m_test_quads_iterations).
                    super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)local_248;
      primitive_mode_00 = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
      local_208 = 0x2f8;
    }
    uVar7 = ((long)uVar7 >> 2) * -0x71c71c71c71c71c7;
    if ((uVar7 & 0xfffffffe) != 0) {
      pvVar3 = all_iterations_data[local_228];
      uVar1 = local_248->n_vertices;
      local_220 = 1;
      do {
        if (2 < uVar1) {
          pfVar8 = (float *)(local_220 * 0x24 +
                            *(long *)((long)&(this->super_TessellationShaderInvarianceBaseTest).
                                             super_TestCaseBase.super_TestCase.super_TestNode.
                                             _vptr_TestNode + local_208));
          pvVar4 = all_iterations_data[(uint)((int)local_228 + (int)local_220)];
          fVar2 = pfVar8[8];
          uVar10 = 0;
          do {
            uVar9 = (ulong)(uint)((int)uVar10 * 9);
            tessellated_vertex_data = (float *)((long)pvVar3 + uVar9 * 4);
            bVar6 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode_00,tessellated_vertex_data);
            if (!bVar6) {
              tessellated_vertex_data_00 = (float *)((long)pvVar3 + uVar9 * 4 + 0xc);
              bVar6 = TessellationShaderUtils::isOuterEdgeVertex
                                (primitive_mode_00,tessellated_vertex_data_00);
              if (!bVar6) {
                tessellated_vertex_data_01 = (float *)((long)pvVar3 + uVar9 * 4 + 0x18);
                bVar6 = TessellationShaderUtils::isOuterEdgeVertex
                                  (primitive_mode_00,tessellated_vertex_data_01);
                if (!bVar6) {
                  primitive_mode = extraout_EDX;
                  if ((uint)fVar2 < 3) {
LAB_00d240b3:
                    TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                              (&local_1d0,
                               (TessellationShaderUtils *)(ulong)local_248->primitive_mode,
                               primitive_mode);
                    local_1b0._0_8_ =
                         ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                          super_TestCase.super_TestNode.m_testCtx)->m_log;
                    this_00 = (ostringstream *)(local_1b0 + 8);
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"For primitive mode [",0x14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,local_1d0._M_dataplus._M_p,
                               local_1d0._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", base inner tessellation levels:",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)local_248->inner_tess_levels[0]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)local_248->inner_tess_levels[1]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", base outer tessellation levels:",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)local_248->outer_tess_levels[0]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)local_248->outer_tess_levels[1]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)local_248->outer_tess_levels[2]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)local_248->outer_tess_levels[3]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", reference inner tessellation levels:",0x26);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)*pfVar8);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)pfVar8[1]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", reference outer tessellation levels:",0x26);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)pfVar8[2]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)pfVar8[3]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)pfVar8[4]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)pfVar8[5]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,
                               ", the following triangle formed during base tessellation run was not found in reference run:"
                               ,0x5c);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)*tessellated_vertex_data);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)tessellated_vertex_data[1]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)tessellated_vertex_data[2]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]x",2);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)*tessellated_vertex_data_00);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)tessellated_vertex_data[4]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)tessellated_vertex_data[5]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]x",2);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
                    std::ostream::_M_insert<double>((double)*tessellated_vertex_data_01);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)tessellated_vertex_data[7]);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                    std::ostream::_M_insert<double>((double)tessellated_vertex_data[8]);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_138);
                    this_01 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (this_01,"Implementation does not appear to be rule 6-conformant",
                               (char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                               ,0x9d4);
                    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                  }
                  uVar9 = 0;
                  while (bVar6 = TessellationShaderUtils::isTriangleDefined
                                           (tessellated_vertex_data,
                                            (float *)((long)pvVar4 + (uVar9 & 0xffffffff) * 4)),
                        !bVar6) {
                    uVar9 = uVar9 + 9;
                    primitive_mode = extraout_EDX_00;
                    if (((ulong)(uint)fVar2 / 3) * 9 == uVar9) goto LAB_00d240b3;
                  }
                }
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != (ulong)uVar1 / 3);
        }
        local_220 = local_220 + 1;
      } while (local_220 != (uVar7 & 0xffffffff));
    }
    bVar6 = !bVar5;
    bVar5 = false;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule6Test::verifyResultData(const void** all_iterations_data)
{
	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */

	for (unsigned int n_iteration = 0; n_iteration < 2 /* quads, triangles */; ++n_iteration)
	{
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();

		const unsigned int n_sets = (n_iteration == 0) ? (const unsigned int)m_test_triangles_iterations.size() :
														 (const unsigned int)m_test_quads_iterations.size();

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		const unsigned int n_triangles_in_base_set = test_iterations[0].n_vertices / 3 /* vertices per triangle */;

		DE_ASSERT(test_iterations.size() != 0);

		/* For each iteration, verify that all vertices generated for all three vertex spacing modes.
		 * are exactly the same (but in different order) */
		const _test_iteration& base_test		= test_iterations[0];
		const float*		   base_vertex_data = (const float*)all_iterations_data[n_base_iteration + 0];

		for (unsigned int n_set = 1; n_set < n_sets; ++n_set)
		{
			const _test_iteration& set_test		   = test_iterations[n_set];
			const float*		   set_vertex_data = (const float*)all_iterations_data[n_base_iteration + n_set];

			/* We're operating on triangles so make sure the amount of vertices we're dealing with is
			 * divisible by 3 */
			DE_ASSERT((test_iterations[n_set].n_vertices % 3) == 0);

			const unsigned int n_triangles_in_curr_set = test_iterations[n_set].n_vertices / 3;

			/* Take base triangles and make sure they can be found in iteration-specific set.
			 * Now, thing to keep in mind here is that we must not assume any specific vertex
			 * and triangle order which is why the slow search. */
			for (unsigned int n_base_triangle = 0; n_base_triangle < n_triangles_in_base_set; ++n_base_triangle)
			{
				/* Extract base triangle data first */
				const float* base_triangle_vertex1 = base_vertex_data +
													 n_base_triangle * 3 *		/* vertices per triangle */
														 3;						/* components */
				const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
				const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */

				/* Only interior triangles should be left intact. Is this an interior triangle? */
				if (!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1) &&
					!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2) &&
					!TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3))
				{
					/* Iterate through all triangles in considered set */
					bool has_base_set_triangle_been_found = false;

					for (unsigned int n_curr_set_triangle = 0; n_curr_set_triangle < n_triangles_in_curr_set;
						 ++n_curr_set_triangle)
					{
						const float* curr_triangle = set_vertex_data +
													 n_curr_set_triangle * 3 * /* vertices per triangle */
														 3;					   /* components */

						if (TessellationShaderUtils::isTriangleDefined(base_triangle_vertex1, curr_triangle))
						{
							has_base_set_triangle_been_found = true;

							break;
						}
					} /* for (all triangles in currently processed set) */

					if (!has_base_set_triangle_been_found)
					{
						std::string primitive_mode_str =
							TessellationShaderUtils::getESTokenForPrimitiveMode(base_test.primitive_mode);

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "]"
							<< ", base inner tessellation levels:"
							<< "[" << base_test.inner_tess_levels[0] << ", " << base_test.inner_tess_levels[1] << "]"
							<< ", base outer tessellation levels:"
							<< "[" << base_test.outer_tess_levels[0] << ", " << base_test.outer_tess_levels[1] << ", "
							<< base_test.outer_tess_levels[2] << ", " << base_test.outer_tess_levels[3] << "]"
							<< ", reference inner tessellation levels:"
							<< "[" << set_test.inner_tess_levels[0] << ", " << set_test.inner_tess_levels[1] << "]"
							<< ", reference outer tessellation levels:"
							<< "[" << set_test.outer_tess_levels[0] << ", " << set_test.outer_tess_levels[1] << ", "
							<< set_test.outer_tess_levels[2] << ", " << set_test.outer_tess_levels[3] << "]"
							<< ", the following triangle formed during base tessellation run was not found in "
							   "reference run:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2]

							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation does not appear to be rule 6-conformant");
					} /* if (triangle created during base run was not found in reference run) */
				}	 /* if (base triangle is interior) */
			}		  /* for (all base set's vertices) */
		}			  /* for (all sets) */
	}				  /* for (both primitive types) */
}